

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall QFormLayout::itemAt(QFormLayout *this,int row,ItemRole role)

{
  long lVar1;
  undefined8 *puVar2;
  _func_int **pp_Var3;
  bool bVar4;
  QLayoutItem *pQVar5;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  if ((uint)row < (uint)(*(ulong *)(lVar1 + 0xd0) >> 1)) {
    if (role < SpanningRole) {
      puVar2 = *(undefined8 **)
                (*(long *)(lVar1 + 200) + (long)(int)((uint)(role != LabelRole) + row * 2) * 8);
      if (puVar2 != (undefined8 *)0x0) {
        return (QLayoutItem *)*puVar2;
      }
    }
    else if (role == SpanningRole) {
      pQVar5 = *(QLayoutItem **)(lVar1 + 200);
      pp_Var3 = (&pQVar5->_vptr_QLayoutItem)[row * 2 + 1];
      bVar4 = true;
      if ((pp_Var3 != (_func_int **)0x0) && (*(char *)(pp_Var3 + 1) == '\x01')) {
        pQVar5 = (QLayoutItem *)*pp_Var3;
        bVar4 = false;
      }
      if (!bVar4) {
        return pQVar5;
      }
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QFormLayout::itemAt(int row, ItemRole role) const
{
    Q_D(const QFormLayout);
    if (uint(row) >= uint(d->m_matrix.rowCount()))
        return nullptr;
    switch (role) {
    case SpanningRole:
        if (QFormLayoutItem *item = d->m_matrix(row, 1))
            if (item->fullRow)
                return item->item;
        break;
    case LabelRole:
    case FieldRole:
        if (QFormLayoutItem *item = d->m_matrix(row, (role == LabelRole) ? 0 : 1))
            return item->item;
        break;
    }
    return nullptr;
}